

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::ComputeAddRange::operator()
          (ComputeAddRange *this,Random *random,int dstMin,int dstMax,int *aMin,int *aMax,int *bMin,
          int *bMax)

{
  deUint32 dVar1;
  int iVar2;
  uint uVar3;
  
  dVar1 = deRandom_getUint32(&random->m_rnd);
  uVar3 = dVar1 % ((dstMax - dstMin) + 1U);
  dVar1 = deRandom_getUint32(&random->m_rnd);
  iVar2 = dVar1 - (((uint)((ulong)dVar1 * 0xf0f0f0f1 >> 0x20) & 0xfffffff0) + dVar1 / 0x11);
  *aMin = dstMin + iVar2 + -8;
  *aMax = iVar2 + dstMin + uVar3 + -8;
  *bMin = 8 - iVar2;
  *bMax = ((dstMax - dstMin) - (iVar2 + uVar3)) + 8;
  return;
}

Assistant:

void ComputeAddRange::operator() (de::Random& random, T dstMin, T dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& rnd, int min, int max) const		{ return rnd.getInt(min, max); }
		float	operator() (de::Random& rnd, float min, float max) const	{ return getQuantizedFloat(rnd, min, max, 0.5f); }
	};

	T rangeLen		= dstMax-dstMin;
	T subRangeLen	= GetRandom()(random, T(0), rangeLen);
	T aOffset		= GetRandom()(random, T(-8), T(8));

	aMin			= dstMin+aOffset;
	aMax			= aMin+subRangeLen;

	bMin			= -aOffset;
	bMax			= -aOffset+(rangeLen-subRangeLen);

#if defined(DE_DEBUG)
	T eps = T(0.001);
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin+bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin+bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax+bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax+bMax, dstMin-eps, dstMax+eps));
#endif
}